

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O2

int xmllintMain(int argc,char **argv,FILE *errStream,xmlResourceLoader loader)

{
  char cVar1;
  undefined8 uVar2;
  FILE *__stream;
  __off_t _Var3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  unsigned_long uVar9;
  int *piVar10;
  long lVar11;
  xmlChar *pxVar12;
  undefined8 *puVar13;
  xmlTextReaderPtr reader;
  xmlParserCtxtPtr pxVar14;
  uint uVar15;
  uint uVar16;
  byte *pbVar17;
  byte *pbVar18;
  int iVar19;
  char *pcVar20;
  xmlSAXHandler *__src;
  char *pcVar21;
  long lVar22;
  size_t sStack_470;
  int local_44c;
  xmllintState local_430;
  stat info;
  
  memset(&local_430.ctxt,0,0x368);
  uVar2 = _xmlParserVersion;
  local_430.repeat = 1;
  local_430.options = 0x410000;
  local_430.errStream = errStream;
  local_430.defaultResourceLoader = loader;
  if (1 < argc) {
    iVar19 = 1;
LAB_00105ea3:
    if (argc <= iVar19) goto LAB_001073a3;
    pcVar21 = argv[iVar19];
    if ((*pcVar21 == '-') && (cVar1 = pcVar21[1], cVar1 != '\0')) {
      iVar5 = strcmp(pcVar21,"-maxmem");
      if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--maxmem"), iVar5 == 0)) {
        iVar19 = iVar19 + 1;
        if (argc <= iVar19) {
          pcVar21 = "maxmem: missing integer value\n";
          sStack_470 = 0x1e;
LAB_00108204:
          fwrite(pcVar21,sStack_470,1,(FILE *)errStream);
          goto LAB_00105e81;
        }
        piVar10 = __errno_location();
        *piVar10 = 0;
        uVar9 = parseInteger(errStream,"maxmem",argv[iVar19],0,0x7fffffff);
        local_430.maxmem = (int)uVar9;
      }
      else {
        iVar5 = strcmp(pcVar21,"-debug");
        if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--debug"), iVar5 == 0)) {
          local_430.debug = 1;
        }
        else {
          iVar5 = strcmp(pcVar21,"-shell");
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--shell"), iVar5 == 0)) {
            local_430.shell = 1;
          }
          else {
            iVar5 = strcmp(pcVar21,"-copy");
            if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--copy"), iVar5 == 0)) {
              local_430.copy = 1;
            }
            else {
              iVar5 = strcmp(pcVar21,"-recover");
              if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--recover"), iVar5 == 0)) {
                local_430.options = local_430.options | 1;
              }
              else {
                iVar5 = strcmp(pcVar21,"-huge");
                if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--huge"), iVar5 == 0)) {
                  local_430.options = local_430.options | 0x80000;
                }
                else {
                  iVar6 = strcmp(pcVar21,"-noent");
                  iVar5 = iVar19;
                  if ((iVar6 == 0) || (iVar6 = strcmp(pcVar21,"--noent"), iVar6 == 0))
                  goto LAB_00107277;
                  iVar5 = strcmp(pcVar21,"-noenc");
                  if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--noenc"), iVar5 == 0)) {
                    local_430.options = local_430.options | 0x200000;
                  }
                  else {
                    iVar5 = strcmp(pcVar21,"-nsclean");
                    if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--nsclean"), iVar5 == 0)) {
                      local_430.options = local_430.options | 0x2000;
                    }
                    else {
                      iVar5 = strcmp(pcVar21,"-nocdata");
                      if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--nocdata"), iVar5 == 0)) {
                        local_430.options = local_430.options | 0x4000;
                      }
                      else {
                        iVar5 = strcmp(pcVar21,"-nodict");
                        if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--nodict"), iVar5 == 0)) {
                          local_430.options = local_430.options | 0x1000;
                        }
                        else {
                          iVar5 = strcmp(pcVar21,"-version");
                          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--version"), iVar5 == 0)) {
                            fprintf((FILE *)errStream,"%s: using libxml version %s\n",*argv,uVar2);
                            fwrite("   compiled with: ",0x12,1,(FILE *)errStream);
                            iVar5 = xmlHasFeature(1);
                            if (iVar5 != 0) {
                              fwrite("Threads ",8,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(2);
                            if (iVar5 != 0) {
                              fwrite("Tree ",5,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(3);
                            if (iVar5 != 0) {
                              fwrite("Output ",7,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(4);
                            if (iVar5 != 0) {
                              fwrite("Push ",5,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(5);
                            if (iVar5 != 0) {
                              fwrite("Reader ",7,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(6);
                            if (iVar5 != 0) {
                              fwrite("Patterns ",9,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(7);
                            if (iVar5 != 0) {
                              fwrite("Writer ",7,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(8);
                            if (iVar5 != 0) {
                              fwrite("SAXv1 ",6,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(10);
                            if (iVar5 != 0) {
                              fwrite("HTTP ",5,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0xb);
                            if (iVar5 != 0) {
                              fwrite("DTDValid ",9,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0xc);
                            if (iVar5 != 0) {
                              fwrite("HTML ",5,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0xd);
                            if (iVar5 != 0) {
                              fwrite("Legacy ",7,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0xe);
                            if (iVar5 != 0) {
                              fwrite("C14N ",5,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0xf);
                            if (iVar5 != 0) {
                              fwrite("Catalog ",8,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x10);
                            if (iVar5 != 0) {
                              fwrite("XPath ",6,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x11);
                            if (iVar5 != 0) {
                              fwrite("XPointer ",9,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x12);
                            if (iVar5 != 0) {
                              fwrite("XInclude ",9,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x13);
                            if (iVar5 != 0) {
                              fwrite("Iconv ",6,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x20);
                            if (iVar5 != 0) {
                              fwrite("ICU ",4,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x14);
                            if (iVar5 != 0) {
                              fwrite("ISO8859X ",9,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x15);
                            if (iVar5 != 0) {
                              fwrite("Unicode ",8,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x16);
                            if (iVar5 != 0) {
                              fwrite("Regexps ",8,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x17);
                            if (iVar5 != 0) {
                              fwrite("Automata ",9,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x18);
                            if (iVar5 != 0) {
                              fwrite("Expr ",5,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x19);
                            if (iVar5 != 0) {
                              fwrite("Schemas ",8,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x1a);
                            if (iVar5 != 0) {
                              fwrite("Schematron ",0xb,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x1b);
                            if (iVar5 != 0) {
                              fwrite("Modules ",8,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x1c);
                            if (iVar5 != 0) {
                              fwrite("Debug ",6,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x1f);
                            if (iVar5 != 0) {
                              fwrite("Zlib ",5,1,(FILE *)errStream);
                            }
                            iVar5 = xmlHasFeature(0x21);
                            if (iVar5 != 0) {
                              fwrite("Lzma ",5,1,(FILE *)errStream);
                            }
                            fputc(10,(FILE *)errStream);
                            local_430.version = 1;
                          }
                          else {
                            iVar5 = strcmp(pcVar21,"-noout");
                            if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--noout"), iVar5 == 0)) {
                              local_430.noout = 1;
                            }
                            else {
                              iVar5 = strcmp(pcVar21,"-htmlout");
                              if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--htmlout"), iVar5 == 0))
                              {
                                local_430.htmlout = 1;
                              }
                              else {
                                iVar5 = strcmp(pcVar21,"-nowrap");
                                if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--nowrap"), iVar5 == 0)
                                   ) {
                                  local_430.nowrap = 1;
                                }
                                else {
                                  iVar5 = strcmp(pcVar21,"-html");
                                  if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,"--html"), iVar5 == 0)
                                     ) {
                                    local_430.html = 1;
                                  }
                                  else {
                                    iVar5 = strcmp(pcVar21,"-xmlout");
                                    if ((iVar5 == 0) ||
                                       (iVar5 = strcmp(pcVar21,"--xmlout"), iVar5 == 0)) {
                                      local_430.xmlout = 1;
                                    }
                                    else {
                                      iVar5 = strcmp(pcVar21,"-nodefdtd");
                                      if ((((iVar5 == 0) ||
                                           (iVar5 = strcmp(pcVar21,"--nodefdtd"), iVar5 == 0)) ||
                                          (iVar5 = strcmp(pcVar21,"-loaddtd"), iVar5 == 0)) ||
                                         (iVar5 = strcmp(pcVar21,"--loaddtd"), iVar5 == 0))
                                      goto LAB_00107015;
                                      iVar5 = strcmp(pcVar21,"-dtdattr");
                                      if ((iVar5 == 0) ||
                                         (iVar5 = strcmp(pcVar21,"--dtdattr"), iVar5 == 0)) {
                                        local_430.options = local_430.options | 8;
                                      }
                                      else {
                                        iVar5 = strcmp(pcVar21,"-valid");
                                        if ((iVar5 == 0) ||
                                           (iVar5 = strcmp(pcVar21,"--valid"), iVar5 == 0)) {
                                          local_430.options = local_430.options | 0x10;
                                        }
                                        else {
                                          iVar5 = strcmp(pcVar21,"-postvalid");
                                          if ((iVar5 == 0) ||
                                             (iVar5 = strcmp(pcVar21,"--postvalid"), iVar5 == 0)) {
                                            local_430.postvalid = 1;
                                          }
                                          else {
                                            iVar5 = strcmp(pcVar21,"-dtdvalid");
                                            if ((iVar5 == 0) ||
                                               (iVar5 = strcmp(pcVar21,"--dtdvalid"), iVar5 == 0)) {
                                              local_430.dtdvalid = argv[(long)iVar19 + 1];
                                              iVar19 = iVar19 + 1;
                                            }
                                            else {
                                              iVar5 = strcmp(pcVar21,"-dtdvalidfpi");
                                              if ((iVar5 != 0) &&
                                                 (iVar5 = strcmp(pcVar21,"--dtdvalidfpi"),
                                                 iVar5 != 0)) {
                                                iVar5 = strcmp(pcVar21,"-insert");
                                                if ((iVar5 == 0) ||
                                                   (iVar5 = strcmp(pcVar21,"--insert"), iVar5 == 0))
                                                {
                                                  local_430.insert = 1;
                                                }
                                                else {
                                                  iVar5 = strcmp(pcVar21,"-dropdtd");
                                                  if ((iVar5 == 0) ||
                                                     (iVar5 = strcmp(pcVar21,"--dropdtd"),
                                                     iVar5 == 0)) {
                                                    local_430.dropdtd = 1;
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar21,"-quiet");
                                                    if ((iVar5 == 0) ||
                                                       (iVar5 = strcmp(pcVar21,"--quiet"),
                                                       iVar5 == 0)) {
                                                      local_430.quiet = 1;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar21,"-timing");
                                                      if ((iVar5 == 0) ||
                                                         (iVar5 = strcmp(pcVar21,"--timing"),
                                                         iVar5 == 0)) {
                                                        local_430.timing = 1;
                                                      }
                                                      else {
                                                        iVar5 = strcmp(pcVar21,"-auto");
                                                        if ((iVar5 == 0) ||
                                                           (iVar5 = strcmp(pcVar21,"--auto"),
                                                           iVar5 == 0)) {
                                                          local_430.generate = 1;
                                                        }
                                                        else {
                                                          iVar5 = strcmp(pcVar21,"-repeat");
                                                          if ((iVar5 == 0) ||
                                                             (iVar5 = strcmp(pcVar21,"--repeat"),
                                                             iVar5 == 0)) {
                                                            if (local_430.repeat < 2) {
                                                              local_430.repeat = 100;
                                                            }
                                                            else {
                                                              local_430.repeat =
                                                                   local_430.repeat * 10;
                                                            }
                                                          }
                                                          else {
                                                            iVar5 = strcmp(pcVar21,"-push");
                                                            if ((iVar5 == 0) ||
                                                               (iVar5 = strcmp(pcVar21,"--push"),
                                                               iVar5 == 0)) {
                                                              local_430.push = 1;
                                                            }
                                                            else {
                                                              iVar5 = strcmp(pcVar21,"-memory");
                                                              if ((iVar5 == 0) ||
                                                                 (iVar5 = strcmp(pcVar21,"--memory")
                                                                 , iVar5 == 0)) {
                                                                local_430.memory = 1;
                                                              }
                                                              else {
                                                                iVar5 = strcmp(pcVar21,"-testIO");
                                                                if ((iVar5 == 0) ||
                                                                   (iVar5 = strcmp(pcVar21,
                                                  "--testIO"), iVar5 == 0)) {
                                                    local_430.testIO = 1;
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar21,"-xinclude");
                                                    if ((iVar5 == 0) ||
                                                       (iVar5 = strcmp(pcVar21,"--xinclude"),
                                                       iVar5 == 0)) {
                                                      local_430.xinclude = 1;
                                                      local_430.options = local_430.options | 0x400;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar21,"-noxincludenode");
                                                      if ((iVar5 == 0) ||
                                                         (iVar5 = strcmp(pcVar21,"--noxincludenode")
                                                         , iVar5 == 0)) {
                                                        local_430.xinclude = 1;
                                                        local_430.options =
                                                             local_430.options | 0x8400;
                                                      }
                                                      else {
                                                        iVar5 = strcmp(pcVar21,"-nofixup-base-uris")
                                                        ;
                                                        if ((iVar5 == 0) ||
                                                           (iVar5 = strcmp(pcVar21,
                                                  "--nofixup-base-uris"), iVar5 == 0)) {
                                                    local_430.xinclude = 1;
                                                    local_430.options = local_430.options | 0x40400;
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar21,"-nowarning");
                                                    if ((iVar5 == 0) ||
                                                       (iVar5 = strcmp(pcVar21,"--nowarning"),
                                                       iVar5 == 0)) {
                                                      local_430.options =
                                                           local_430.options & 0xffffff3fU | 0x40;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar21,"-pedantic");
                                                      if ((iVar5 == 0) ||
                                                         (iVar5 = strcmp(pcVar21,"--pedantic"),
                                                         iVar5 == 0)) {
                                                        local_430.options =
                                                             local_430.options & 0xffffff3fU | 0x80;
                                                      }
                                                      else {
                                                        iVar5 = strcmp(pcVar21,"-debugent");
                                                        if ((iVar5 != 0) &&
                                                           (iVar5 = strcmp(pcVar21,"--debugent"),
                                                           iVar5 != 0)) {
                                                          iVar5 = strcmp(pcVar21,"-c14n");
                                                          if ((iVar5 == 0) ||
                                                             (iVar5 = strcmp(pcVar21,"--c14n"),
                                                             iVar5 == 0)) {
                                                            local_430.canonical = 1;
                                                          }
                                                          else {
                                                            iVar5 = strcmp(pcVar21,"-c14n11");
                                                            if ((iVar5 == 0) ||
                                                               (iVar5 = strcmp(pcVar21,"--c14n11"),
                                                               iVar5 == 0)) {
                                                              local_430.canonical_11 = 1;
                                                            }
                                                            else {
                                                              iVar5 = strcmp(pcVar21,"-exc-c14n");
                                                              if ((iVar5 != 0) &&
                                                                 (iVar5 = strcmp(pcVar21,
                                                  "--exc-c14n"), iVar5 != 0)) {
                                                    iVar5 = strcmp(pcVar21,"-catalogs");
                                                    if ((iVar5 == 0) ||
                                                       (iVar5 = strcmp(pcVar21,"--catalogs"),
                                                       iVar5 == 0)) {
                                                      local_430.catalogs = 1;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar21,"-nocatalogs");
                                                      if ((iVar5 == 0) ||
                                                         (iVar5 = strcmp(pcVar21,"--nocatalogs"),
                                                         iVar5 == 0)) {
                                                        local_430.nocatalogs = 1;
                                                      }
                                                      else {
                                                        iVar5 = strcmp(pcVar21,"-noblanks");
                                                        if ((iVar5 == 0) ||
                                                           (iVar5 = strcmp(pcVar21,"--noblanks"),
                                                           iVar5 == 0)) {
LAB_001071c5:
                                                          local_430.options =
                                                               local_430.options | 0x100;
                                                        }
                                                        else if (((cVar1 == 'o') &&
                                                                 (pcVar21[2] == '\0')) ||
                                                                ((iVar5 = strcmp(pcVar21,"-output"),
                                                                 iVar5 == 0 ||
                                                                 (iVar5 = strcmp(pcVar21,"--output")
                                                                 , iVar5 == 0)))) {
                                                          local_430.output = argv[(long)iVar19 + 1];
                                                          iVar19 = iVar19 + 1;
                                                        }
                                                        else {
                                                          iVar5 = strcmp(pcVar21,"-format");
                                                          if ((iVar5 == 0) ||
                                                             (iVar5 = strcmp(pcVar21,"--format"),
                                                             iVar5 == 0)) {
                                                            local_430.format = 1;
                                                            goto LAB_001071c5;
                                                          }
                                                          iVar5 = strcmp(pcVar21,"-encode");
                                                          if ((iVar5 == 0) ||
                                                             (iVar5 = strcmp(pcVar21,"--encode"),
                                                             iVar5 == 0)) {
                                                            local_430.encoding =
                                                                 argv[(long)iVar19 + 1];
                                                            iVar19 = iVar19 + 1;
                                                          }
                                                          else {
                                                            iVar5 = strcmp(pcVar21,"-pretty");
                                                            if ((iVar5 == 0) ||
                                                               (iVar5 = strcmp(pcVar21,"--pretty"),
                                                               iVar5 == 0)) {
                                                              iVar5 = iVar19 + 1;
                                                              lVar11 = (long)iVar19;
                                                              iVar19 = iVar5;
                                                              if (argv[lVar11 + 1] != (char *)0x0) {
                                                                local_430.format =
                                                                     atoi(argv[lVar11 + 1]);
                                                              }
                                                            }
                                                            else {
                                                              iVar5 = strcmp(pcVar21,"-stream");
                                                              if ((iVar5 == 0) ||
                                                                 (iVar5 = strcmp(pcVar21,"--stream")
                                                                 , iVar5 == 0)) {
                                                                local_430.stream = 1;
                                                              }
                                                              else {
                                                                iVar5 = strcmp(pcVar21,"-walker");
                                                                if ((iVar5 == 0) ||
                                                                   (iVar5 = strcmp(pcVar21,
                                                  "--walker"), iVar5 == 0)) {
                                                    local_430.walker = 1;
                                                    local_430.noout = 1;
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar21,"-pattern");
                                                    if ((iVar5 == 0) ||
                                                       (iVar5 = strcmp(pcVar21,"--pattern"),
                                                       iVar5 == 0)) {
                                                      local_430.pattern = argv[(long)iVar19 + 1];
                                                      iVar19 = iVar19 + 1;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar21,"-sax1");
                                                      if ((iVar5 == 0) ||
                                                         (iVar5 = strcmp(pcVar21,"--sax1"),
                                                         iVar5 == 0)) {
                                                        local_430.options =
                                                             local_430.options | 0x200;
                                                      }
                                                      else {
                                                        iVar5 = strcmp(pcVar21,"-sax");
                                                        if ((iVar5 != 0) &&
                                                           (iVar5 = strcmp(pcVar21,"--sax"),
                                                           iVar5 != 0)) {
                                                          iVar5 = strcmp(pcVar21,"-relaxng");
                                                          if ((iVar5 == 0) ||
                                                             (iVar5 = strcmp(pcVar21,"--relaxng"),
                                                             iVar5 == 0)) {
                                                            iVar5 = iVar19 + 1;
                                                            local_430.relaxng =
                                                                 argv[(long)iVar19 + 1];
                                                          }
                                                          else {
                                                            iVar5 = strcmp(pcVar21,"-schema");
                                                            if ((iVar5 == 0) ||
                                                               (iVar5 = strcmp(pcVar21,"--schema"),
                                                               iVar5 == 0)) {
                                                              iVar5 = iVar19 + 1;
                                                              local_430.schema =
                                                                   argv[(long)iVar19 + 1];
                                                            }
                                                            else {
                                                              iVar5 = strcmp(pcVar21,"-schematron");
                                                              if ((iVar5 != 0) &&
                                                                 (iVar5 = strcmp(pcVar21,
                                                  "--schematron"), iVar5 != 0)) {
                                                    iVar5 = strcmp(pcVar21,"-nonet");
                                                    if ((iVar5 == 0) ||
                                                       (iVar5 = strcmp(pcVar21,"--nonet"),
                                                       iVar5 == 0)) {
                                                      local_430.options = local_430.options | 0x800;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar21,"-nocompact");
                                                      if ((iVar5 == 0) ||
                                                         (iVar5 = strcmp(pcVar21,"--nocompact"),
                                                         iVar5 == 0)) {
                                                        local_430.options =
                                                             local_430.options & 0xfffeffff;
                                                      }
                                                      else {
                                                        iVar5 = strcmp(pcVar21,"-load-trace");
                                                        if ((iVar5 == 0) ||
                                                           (iVar5 = strcmp(pcVar21,"--load-trace"),
                                                           iVar5 == 0)) {
                                                          local_430.load_trace = 1;
                                                        }
                                                        else {
                                                          iVar5 = strcmp(pcVar21,"-path");
                                                          if ((iVar5 == 0) ||
                                                             (iVar5 = strcmp(pcVar21,"--path"),
                                                             iVar5 == 0)) {
                                                            iVar5 = iVar19 + 1;
                                                            pbVar18 = (byte *)argv[(long)iVar19 + 1]
                                                            ;
                                                            iVar19 = iVar5;
                                                            if (pbVar18 != (byte *)0x0) {
                                                              do {
                                                                iVar5 = local_430.nbpaths;
                                                                lVar11 = (long)local_430.nbpaths;
                                                                do {
                                                                  do {
                                                                    bVar4 = *pbVar18;
                                                                    if (bVar4 == 0)
                                                                    goto LAB_0010727f;
                                                                    pbVar17 = pbVar18;
                                                                    if (0x3f < iVar5) {
                                                                      fwrite(
                                                  "MAX_PATHS reached: too many paths\n",0x22,1,
                                                  (FILE *)local_430.errStream);
                                                  local_430.progresult = XMLLINT_ERR_UNCLASS;
                                                  goto LAB_0010727f;
                                                  }
                                                  while ((bVar4 == 0x20 || (bVar4 == 0x3a))) {
                                                    pbVar18 = pbVar17 + 1;
                                                    pbVar17 = pbVar17 + 1;
                                                    bVar4 = *pbVar18;
                                                  }
                                                  lVar22 = 0;
                                                  while ((0x3a < bVar4 ||
                                                         ((0x400000100000001U >>
                                                           ((ulong)bVar4 & 0x3f) & 1) == 0))) {
                                                    bVar4 = pbVar17[lVar22 + 1];
                                                    lVar22 = lVar22 + 1;
                                                  }
                                                  pbVar18 = pbVar17;
                                                  } while (lVar22 == 0);
                                                  pxVar12 = (xmlChar *)xmlStrndup(pbVar17);
                                                  local_430.paths[lVar11] = pxVar12;
                                                  pbVar18 = pbVar17 + lVar22;
                                                  } while (pxVar12 == (xmlChar *)0x0);
                                                  local_430.nbpaths = iVar5 + 1;
                                                  pbVar18 = pbVar17 + lVar22;
                                                  } while( true );
                                                  }
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar21,"-xpath");
                                                    if ((iVar5 == 0) ||
                                                       (iVar5 = strcmp(pcVar21,"--xpath"),
                                                       iVar5 == 0)) {
                                                      local_430.noout = local_430.noout + 1;
                                                      local_430.xpathquery = argv[(long)iVar19 + 1];
                                                      iVar19 = iVar19 + 1;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar21,"-oldxml10");
                                                      if ((iVar5 != 0) &&
                                                         (iVar5 = strcmp(pcVar21,"--oldxml10"),
                                                         iVar5 != 0)) {
                                                        iVar5 = strcmp(pcVar21,"-max-ampl");
                                                        if ((iVar5 == 0) ||
                                                           (iVar5 = strcmp(pcVar21,"--max-ampl"),
                                                           iVar5 == 0)) {
                                                          iVar19 = iVar19 + 1;
                                                          if (argc <= iVar19) {
                                                            pcVar21 = 
                                                  "max-ampl: missing integer value\n";
                                                  sStack_470 = 0x20;
                                                  goto LAB_00108204;
                                                  }
                                                  uVar9 = parseInteger(errStream,"max-ampl",
                                                                       argv[iVar19],1,0xffffffff);
                                                  local_430.maxAmpl = (uint)uVar9;
                                                  goto LAB_0010727f;
                                                  }
                                                  fprintf((FILE *)errStream,"Unknown option %s\n",
                                                          pcVar21);
                                                  pcVar21 = *argv;
                                                  goto LAB_00105e7c;
                                                  }
                                                  local_430.options = local_430.options | 0x20000;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_0010727f;
                                                  }
                                                  iVar5 = iVar19 + 1;
                                                  local_430.schematron = argv[(long)iVar19 + 1];
                                                  }
                                                  }
LAB_00107277:
                                                  local_430.options = local_430.options | 2;
                                                  iVar19 = iVar5;
                                                  goto LAB_0010727f;
                                                  }
                                                  local_430.sax = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_0010727f;
                                                  }
                                                  local_430.exc_canonical = 1;
                                                  }
                                                  }
                                                  local_430.options = local_430.options | 0xe;
                                                  goto LAB_0010727f;
                                                  }
                                                  local_430.debugent = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                                goto LAB_0010727f;
                                              }
                                              local_430.dtdvalidfpi = argv[(long)iVar19 + 1];
                                              iVar19 = iVar19 + 1;
                                            }
                                          }
LAB_00107015:
                                          local_430.options = local_430.options | 4;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010727f:
    iVar19 = iVar19 + 1;
    goto LAB_00105ea3;
  }
  pcVar21 = *argv;
LAB_00105e7c:
  usage(errStream,pcVar21);
LAB_00105e81:
  local_430.progresult = XMLLINT_ERR_UNCLASS;
  goto LAB_0010832f;
LAB_001073a3:
  if (local_430.shell != 0) {
    local_430.repeat = 1;
  }
  if (local_430.maxmem != 0) {
    xmllintMaxmemReached = 0;
    xmlMemSetup(myFreeFunc,myMallocFunc,myReallocFunc,myStrdupFunc);
  }
  xmlCheckVersion(0x5398);
  if ((local_430.nocatalogs == 0) && (local_430.catalogs != 0)) {
    pcVar21 = getenv("SGML_CATALOG_FILES");
    if (pcVar21 == (char *)0x0) {
      fwrite("Variable $SGML_CATALOG_FILES not set\n",0x25,1,(FILE *)errStream);
    }
    else {
      xmlLoadCatalogs(pcVar21);
    }
  }
  pcVar21 = getenv("XMLLINT_INDENT");
  if (pcVar21 != (char *)0x0) {
    puVar13 = (undefined8 *)__xmlTreeIndentString();
    *puVar13 = pcVar21;
  }
  if (local_430.htmlout == 0) {
LAB_001074de:
    if (((local_430.schematron == (char *)0x0) || (local_430.sax != 0)) || (local_430.stream != 0))
    {
LAB_0010757f:
      if ((local_430.sax == 0 && local_430.stream == 0) && local_430.relaxng != (char *)0x0) {
        local_430.options = local_430.options | 4;
        if (local_430.timing != 0) {
          getTime(&local_430.begin);
        }
        lVar11 = xmlRelaxNGNewParserCtxt(local_430.relaxng);
        if (lVar11 != 0) {
          xmlRelaxNGSetResourceLoader(lVar11,xmllintResourceLoader,&local_430);
          local_430.relaxngschemas = (xmlRelaxNGPtr)xmlRelaxNGParse(lVar11);
          if (local_430.relaxngschemas == (xmlRelaxNGPtr)0x0) {
            pcVar20 = "Relax-NG schema %s failed to compile\n";
            pcVar21 = local_430.relaxng;
            goto LAB_0010831d;
          }
          xmlRelaxNGFreeParserCtxt(lVar11);
LAB_001076a1:
          if (local_430.timing != 0) {
            endTimer(&local_430,"Compiling the schemas");
          }
LAB_001076be:
          if (((local_430.pattern == (char *)0x0) || (local_430.walker != 0)) ||
             (iVar19 = xmlPatternCompileSafe(local_430.pattern,0,0,0,&local_430.patternc),
             local_430.patternc != (xmlPatternPtr)0x0)) {
            local_44c = 0;
            for (iVar19 = 1; iVar19 < argc; iVar19 = iVar19 + 1) {
              pcVar21 = argv[iVar19];
              uVar16 = 1;
              if ((*pcVar21 == '-') && (pcVar21[1] != '\0')) {
                iVar5 = strcmp(pcVar21,"-path");
                uVar15 = 1;
                if ((((((((iVar5 != 0) &&
                         (iVar5 = strcmp(pcVar21,"--path"), uVar15 = uVar16, iVar5 != 0)) &&
                        (iVar5 = strcmp(pcVar21,"-maxmem"), iVar5 != 0)) &&
                       (iVar5 = strcmp(pcVar21,"--maxmem"), iVar5 != 0)) &&
                      ((pcVar21[1] != 'o' || (pcVar21[2] != '\0')))) &&
                     ((iVar5 = strcmp(pcVar21,"-output"), iVar5 != 0 &&
                      ((iVar5 = strcmp(pcVar21,"--output"), iVar5 != 0 &&
                       (iVar5 = strcmp(pcVar21,"-encode"), iVar5 != 0)))))) &&
                    ((iVar5 = strcmp(pcVar21,"--encode"), iVar5 != 0 &&
                     ((((((iVar5 = strcmp(pcVar21,"-pretty"), iVar5 != 0 &&
                          (iVar5 = strcmp(pcVar21,"--pretty"), iVar5 != 0)) &&
                         (iVar5 = strcmp(pcVar21,"-dtdvalid"), iVar5 != 0)) &&
                        (((iVar5 = strcmp(pcVar21,"--dtdvalid"), iVar5 != 0 &&
                          (iVar5 = strcmp(pcVar21,"-dtdvalidfpi"), iVar5 != 0)) &&
                         ((iVar5 = strcmp(pcVar21,"--dtdvalidfpi"), iVar5 != 0 &&
                          ((iVar5 = strcmp(pcVar21,"-relaxng"), iVar5 != 0 &&
                           (iVar5 = strcmp(pcVar21,"--relaxng"), iVar5 != 0)))))))) &&
                       (iVar5 = strcmp(pcVar21,"-schema"), iVar5 != 0)) &&
                      (((iVar5 = strcmp(pcVar21,"--schema"), iVar5 != 0 &&
                        (iVar5 = strcmp(pcVar21,"-schematron"), iVar5 != 0)) &&
                       (iVar5 = strcmp(pcVar21,"--schematron"), iVar5 != 0)))))))) &&
                   (((iVar5 = strcmp(pcVar21,"-pattern"), iVar5 != 0 &&
                     (iVar5 = strcmp(pcVar21,"--pattern"), iVar5 != 0)) &&
                    ((iVar5 = strcmp(pcVar21,"-xpath"), iVar5 != 0 &&
                     ((iVar5 = strcmp(pcVar21,"--xpath"), iVar5 != 0 &&
                      (iVar5 = strcmp(pcVar21,"-max-ampl"), iVar5 != 0)))))))) {
                  iVar5 = strcmp(pcVar21,"--max-ampl");
                  uVar15 = (uint)(iVar5 == 0);
                }
                iVar19 = iVar19 + uVar15;
              }
              else {
                iVar5 = -1;
                if (local_430.memory != 0) {
                  iVar5 = stat64(pcVar21,(stat64 *)&info);
                  if ((-1 < iVar5) && (iVar5 = open64(pcVar21,0), _Var3 = info.st_size, -1 < iVar5))
                  {
                    local_430.memoryData = (char *)mmap64((void *)0x0,info.st_size + 1,1,1,iVar5,0);
                    if (local_430.memoryData != (char *)0xffffffffffffffff) {
                      local_430.memorySize = _Var3;
                      goto LAB_00107a42;
                    }
                    close(iVar5);
                    fprintf((FILE *)errStream,"mmap failure for file %s\n",pcVar21);
                  }
                  local_430.progresult = XMLLINT_ERR_RDFILE;
                  break;
                }
LAB_00107a42:
                if ((local_430.timing != 0) && (1 < local_430.repeat)) {
                  getTime(&local_430.begin);
                }
                if (local_430.stream == 0) {
                  if (local_430.html == 0) {
                    if (local_430.push == 0) {
                      pxVar14 = (xmlParserCtxtPtr)xmlNewParserCtxt();
                    }
                    else {
                      pxVar14 = (xmlParserCtxtPtr)xmlCreatePushParserCtxt(0,0,0,0,pcVar21);
                      xmlCtxtUseOptions(pxVar14,local_430.options);
                    }
                  }
                  else if (local_430.push == 0) {
                    pxVar14 = (xmlParserCtxtPtr)htmlNewParserCtxt();
                  }
                  else {
                    pxVar14 = (xmlParserCtxtPtr)htmlCreatePushParserCtxt(0,0,0,0,pcVar21);
                    htmlCtxtUseOptions(pxVar14,local_430.options);
                  }
                  if (pxVar14 == (xmlParserCtxtPtr)0x0) goto LAB_0010826b;
                  if (local_430.sax != 0) {
                    __src = &debugSAXHandler;
                    if (((uint)local_430.options >> 9 & 1) == 0) {
                      __src = &debugSAX2Handler;
                    }
                    if (local_430.noout != 0) {
                      __src = &emptySAXHandler;
                    }
                    memcpy(pxVar14->sax,__src,0x100);
                    pxVar14->userData = &local_430;
                  }
                  xmlCtxtSetResourceLoader(pxVar14,xmllintResourceLoader,&local_430);
                  if (local_430.maxAmpl != 0) {
                    xmlCtxtSetMaxAmplification(pxVar14);
                  }
                  if (local_430.htmlout != 0) {
                    pxVar14->_private = &local_430;
                    xmlCtxtSetErrorHandler(pxVar14,xmlHTMLError,pxVar14);
                  }
                  local_430.ctxt = pxVar14;
                  for (iVar6 = 0; iVar6 < local_430.repeat; iVar6 = iVar6 + 1) {
                    if ((iVar6 != 0) && (local_430.push != 0)) {
                      xmlCtxtResetPush(pxVar14,0,0,0,0);
                    }
                    if (local_430.sax == 0) {
                      parseAndPrintFile(&local_430,pcVar21);
                    }
                    else {
                      local_430.callbacks = 0;
                      if (local_430.wxschemas == (xmlSchemaPtr)0x0) {
                        if (local_430.html == 0) {
                          parseXml(&local_430,pcVar21);
                        }
                        else {
                          parseHtml(&local_430,pcVar21);
                        }
                      }
                      else {
                        if ((*pcVar21 == '-') && (pcVar21[1] == '\0')) {
                          lVar11 = xmlParserInputBufferCreateFd(0);
                        }
                        else {
                          lVar11 = xmlParserInputBufferCreateFilename();
                        }
                        if (lVar11 != 0) {
                          lVar22 = xmlSchemaNewValidCtxt(local_430.wxschemas);
                          if (lVar22 == 0) {
                            local_430.progresult = XMLLINT_ERR_MEM;
                            xmlFreeParserInputBuffer();
                          }
                          else {
                            xmlSchemaValidateSetFilename(lVar22,pcVar21);
                            iVar7 = xmlSchemaValidateStream(lVar22,lVar11,0);
                            if (local_430.repeat == 1) {
                              if (iVar7 == 0) {
                                if (local_430.quiet == 0) {
                                  fprintf((FILE *)local_430.errStream,"%s validates\n",pcVar21);
                                }
                              }
                              else {
                                if (iVar7 < 1) {
                                  pcVar20 = "%s validation generated an internal error\n";
                                }
                                else {
                                  pcVar20 = "%s fails to validate\n";
                                }
                                fprintf((FILE *)local_430.errStream,pcVar20,pcVar21);
                                local_430.progresult = XMLLINT_ERR_VALID;
                              }
                            }
                            xmlSchemaFreeValidCtxt();
                          }
                        }
                      }
                    }
                  }
                  xmlFreeParserCtxt();
                }
                else {
                  for (iVar6 = 0; __stream = local_430.errStream, iVar6 < local_430.repeat;
                      iVar6 = iVar6 + 1) {
                    if (local_430.memory == 0) {
                      if ((*pcVar21 == '-') && (pcVar21[1] == '\0')) {
                        reader = (xmlTextReaderPtr)xmlReaderForFd(0,"-",0,local_430.options);
                        goto LAB_00107ab4;
                      }
                      xmlResetLastError();
                      lVar11 = xmlParserInputBufferCreateFilename();
                      if (lVar11 == 0) {
                        lVar11 = xmlGetLastError();
                        if ((lVar11 == 0) || (*(int *)(lVar11 + 4) != 2)) {
                          fprintf((FILE *)__stream,"Unable to open %s\n",pcVar21);
                          local_430.progresult = XMLLINT_ERR_RDFILE;
                          goto LAB_00107ee9;
                        }
                        goto LAB_00107ebd;
                      }
                      reader = (xmlTextReaderPtr)xmlNewTextReader(lVar11);
                      if ((reader != (xmlTextReaderPtr)0x0) &&
                         (iVar7 = xmlTextReaderSetup(reader,0,0,0), -1 < iVar7)) goto LAB_00107ac3;
                      local_430.progresult = XMLLINT_ERR_MEM;
                      xmlFreeParserInputBuffer();
                    }
                    else {
                      reader = (xmlTextReaderPtr)
                               xmlReaderForMemory(local_430.memoryData,
                                                  local_430.memorySize & 0xffffffff,pcVar21);
LAB_00107ab4:
                      if (reader == (xmlTextReaderPtr)0x0) {
LAB_00107ebd:
                        local_430.progresult = XMLLINT_ERR_MEM;
                      }
                      else {
                        lVar11 = 0;
LAB_00107ac3:
                        if (((local_430.patternc != (xmlPatternPtr)0x0) &&
                            (local_430.patstream = (xmlStreamCtxtPtr)xmlPatternGetStreamCtxt(),
                            local_430.patstream != (xmlStreamCtxtPtr)0x0)) &&
                           (iVar7 = xmlStreamPush(local_430.patstream,0,0), iVar7 < 0)) {
                          fwrite("xmlStreamPush() failure\n",0x18,1,(FILE *)__stream);
                          xmlFreeStreamCtxt(local_430.patstream);
                          local_430.patstream = (xmlStreamCtxtPtr)0x0;
                        }
                        xmlTextReaderSetResourceLoader(reader,xmllintResourceLoader,&local_430);
                        if (local_430.maxAmpl != 0) {
                          xmlTextReaderSetMaxAmplification(reader);
                        }
                        if (local_430.relaxng != (char *)0x0) {
                          if (local_430.repeat == 1 && local_430.timing != 0) {
                            getTime(&local_430.begin);
                          }
                          iVar7 = xmlTextReaderRelaxNGValidate(reader,local_430.relaxng);
                          if (iVar7 < 0) {
                            fprintf((FILE *)__stream,"Relax-NG schema %s failed to compile\n",
                                    local_430.relaxng);
                            local_430.progresult = XMLLINT_ERR_SCHEMACOMP;
                            local_430.relaxng = (char *)0x0;
                          }
                          if (local_430.repeat == 1 && local_430.timing != 0) {
                            endTimer(&local_430,"Compiling the schemas");
                          }
                        }
                        if (local_430.schema == (char *)0x0) {
LAB_00107ca5:
                          if ((local_430.timing != 0) && (local_430.repeat == 1)) {
                            getTime(&local_430.begin);
                          }
                        }
                        else {
                          if (local_430.repeat == 1 && local_430.timing != 0) {
                            getTime(&local_430.begin);
                          }
                          iVar7 = xmlTextReaderSchemaValidate(reader);
                          if (iVar7 < 0) {
                            fprintf((FILE *)__stream,"XSD schema %s failed to compile\n",
                                    local_430.schema);
                            local_430.progresult = XMLLINT_ERR_SCHEMACOMP;
                            local_430.schema = (char *)0x0;
                          }
                          if ((local_430.timing != 0) && (local_430.repeat == 1)) {
                            endTimer(&local_430,"Compiling the schemas");
                            goto LAB_00107ca5;
                          }
                        }
                        while (iVar7 = xmlTextReaderRead(reader), iVar7 == 1) {
                          if ((local_430.debug != 0) || (local_430.patternc != (xmlPatternPtr)0x0))
                          {
                            processNode(&local_430,reader);
                          }
                        }
                        if ((local_430.timing != 0) && (local_430.repeat == 1)) {
                          pcVar20 = "Parsing and validating";
                          if ((local_430.options & 0x10U) == 0) {
                            pcVar20 = "Parsing";
                          }
                          if (local_430.relaxng != (char *)0x0) {
                            pcVar20 = "Parsing and validating";
                          }
                          endTimer(&local_430,pcVar20);
                        }
                        if (((local_430.options & 0x10U) != 0) &&
                           (iVar8 = xmlTextReaderIsValid(reader), iVar8 != 1)) {
                          fprintf((FILE *)__stream,"Document %s does not validate\n",pcVar21);
                          local_430.progresult = XMLLINT_ERR_VALID;
                        }
                        if (local_430.schema != (char *)0x0 || local_430.relaxng != (char *)0x0) {
                          iVar8 = xmlTextReaderIsValid(reader);
                          if (iVar8 == 1) {
                            if (local_430.quiet == 0) {
                              fprintf((FILE *)__stream,"%s validates\n",pcVar21);
                            }
                          }
                          else {
                            fprintf((FILE *)__stream,"%s fails to validate\n",pcVar21);
                            local_430.progresult = XMLLINT_ERR_VALID;
                          }
                        }
                        xmlFreeTextReader(reader);
                        xmlFreeParserInputBuffer(lVar11);
                        if (iVar7 != 0) {
                          fprintf((FILE *)__stream,"%s : failed to parse\n",pcVar21);
                          local_430.progresult = XMLLINT_ERR_UNCLASS;
                        }
                        if (local_430.patstream != (xmlStreamCtxtPtr)0x0) {
                          xmlFreeStreamCtxt();
                          local_430.patstream = (xmlStreamCtxtPtr)0x0;
                        }
                      }
                    }
LAB_00107ee9:
                  }
                }
                if ((local_430.timing != 0) && (1 < local_430.repeat)) {
                  endTimer(&local_430,"%d iterations");
                }
                local_44c = local_44c + 1;
                if (local_430.memory != 0) {
                  munmap(local_430.memoryData,local_430.memorySize);
                  close(iVar5);
                }
              }
            }
            if (local_430.generate != 0) {
              parseAndPrintFile(&local_430,(char *)0x0);
            }
            if ((local_430.htmlout != 0) && (local_430.nowrap == 0)) {
              fwrite("</body></html>\n",0xf,1,(FILE *)errStream);
            }
            if (((local_44c != 0) || (local_430.generate != 0)) || (local_430.version != 0))
            goto LAB_0010832f;
            pcVar21 = *argv;
            goto LAB_00105e7c;
          }
          if (-1 < iVar19) {
            fprintf((FILE *)errStream,"Pattern %s failed to compile\n",local_430.pattern);
            local_430.progresult = XMLLINT_ERR_SCHEMAPAT;
            goto LAB_0010832f;
          }
        }
      }
      else {
        if (local_430.schema == (char *)0x0 || local_430.stream != 0) goto LAB_001076be;
        if (local_430.timing != 0) {
          getTime(&local_430.begin);
        }
        lVar11 = xmlSchemaNewParserCtxt(local_430.schema);
        if (lVar11 != 0) {
          xmlSchemaSetResourceLoader(lVar11,xmllintResourceLoader,&local_430);
          local_430.wxschemas = (xmlSchemaPtr)xmlSchemaParse(lVar11);
          if (local_430.wxschemas != (xmlSchemaPtr)0x0) {
            xmlSchemaFreeParserCtxt(lVar11);
            goto LAB_001076a1;
          }
          pcVar20 = "WXS schema %s failed to compile\n";
          pcVar21 = local_430.schema;
          goto LAB_0010831d;
        }
      }
    }
    else {
      local_430.options = local_430.options | 4;
      if (local_430.timing != 0) {
        getTime(&local_430.begin);
      }
      pcVar21 = local_430.schematron;
      lVar11 = xmlSchematronNewParserCtxt(local_430.schematron);
      if (lVar11 != 0) {
        local_430.wxschematron = (xmlSchematronPtr)xmlSchematronParse(lVar11);
        if (local_430.wxschematron != (xmlSchematronPtr)0x0) {
          xmlSchematronFreeParserCtxt(lVar11);
          if (local_430.timing != 0) {
            endTimer(&local_430,"Compiling the schemas");
          }
          goto LAB_0010757f;
        }
        pcVar20 = "Schematron schema %s failed to compile\n";
LAB_0010831d:
        fprintf((FILE *)errStream,pcVar20,pcVar21);
        local_430.progresult = XMLLINT_ERR_SCHEMACOMP;
        goto LAB_0010832f;
      }
    }
  }
  else {
    local_430.htmlBuf = (char *)(*_xmlMalloc)(50000);
    if (local_430.htmlBuf != (char *)0x0) {
      if (local_430.nowrap == 0) {
        fwrite("<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0 Transitional//EN\"\n",0x3e,1,
               (FILE *)errStream);
        fwrite("\t\"http://www.w3.org/TR/REC-html40/loose.dtd\">\n",0x2e,1,(FILE *)errStream);
        fprintf((FILE *)errStream,"<html><head><title>%s output</title></head>\n",*argv);
        fprintf((FILE *)errStream,"<body bgcolor=\"#ffffff\"><h1 align=\"center\">%s output</h1>\n",
                *argv);
      }
      goto LAB_001074de;
    }
  }
LAB_0010826b:
  local_430.progresult = XMLLINT_ERR_MEM;
LAB_0010832f:
  if (local_430.htmlout != 0) {
    (*_xmlFree)(local_430.htmlBuf);
  }
  if (local_430.wxschematron != (xmlSchematronPtr)0x0) {
    xmlSchematronFree();
  }
  if (local_430.relaxngschemas != (xmlRelaxNGPtr)0x0) {
    xmlRelaxNGFree();
  }
  if (local_430.wxschemas != (xmlSchemaPtr)0x0) {
    xmlSchemaFree();
  }
  if (local_430.patternc != (xmlPatternPtr)0x0) {
    xmlFreePattern();
  }
  xmlCleanupParser();
  if ((local_430.maxmem == 0) || ((xmllintMaxmemReached & 1) == 0)) {
    if (local_430.progresult == XMLLINT_ERR_MEM) {
      fwrite("Out-of-memory error reported\n",0x1d,1,(FILE *)errStream);
    }
  }
  else {
    fprintf((FILE *)errStream,"Maximum memory exceeded (%d bytes)\n",0);
  }
  return local_430.progresult;
}

Assistant:

int
xmllintMain(int argc, const char **argv, FILE *errStream,
            xmlResourceLoader loader) {
    xmllintState state, *lint;
    int i, j, res;
    int files = 0;

#ifdef _WIN32
    _setmode(_fileno(stdin), _O_BINARY);
    _setmode(_fileno(stdout), _O_BINARY);
    _setmode(_fileno(stderr), _O_BINARY);
#endif

    lint = &state;
    xmllintInit(lint);
    lint->errStream = errStream;
    lint->defaultResourceLoader = loader;

    res = xmllintParseOptions(lint, argc, argv);
    if (res != XMLLINT_RETURN_OK) {
        lint->progresult = res;
        goto error;
    }

    if (lint->maxmem != 0) {
        xmllintMaxmem = 0;
        xmllintMaxmemReached = 0;
        xmllintOom = 0;
        xmlMemSetup(myFreeFunc, myMallocFunc, myReallocFunc, myStrdupFunc);
    }

    LIBXML_TEST_VERSION

#ifdef LIBXML_CATALOG_ENABLED
    if (lint->nocatalogs == 0) {
	if (lint->catalogs) {
	    const char *catal;

	    catal = getenv("SGML_CATALOG_FILES");
	    if (catal != NULL) {
		xmlLoadCatalogs(catal);
	    } else {
		fprintf(errStream, "Variable $SGML_CATALOG_FILES not set\n");
	    }
	}
    }
#endif

#ifdef LIBXML_OUTPUT_ENABLED
    {
        const char *indent = getenv("XMLLINT_INDENT");
        if (indent != NULL) {
            xmlTreeIndentString = indent;
        }
    }
#endif

    if (lint->htmlout) {
        lint->htmlBuf = xmlMalloc(HTML_BUF_SIZE);
        if (lint->htmlBuf == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }

        if (!lint->nowrap) {
            fprintf(errStream,
             "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0 Transitional//EN\"\n");
            fprintf(errStream,
                    "\t\"http://www.w3.org/TR/REC-html40/loose.dtd\">\n");
            fprintf(errStream,
             "<html><head><title>%s output</title></head>\n",
                    argv[0]);
            fprintf(errStream,
             "<body bgcolor=\"#ffffff\"><h1 align=\"center\">%s output</h1>\n",
                    argv[0]);
        }
    }

#ifdef LIBXML_SCHEMATRON_ENABLED
    if ((lint->schematron != NULL) && (lint->sax == 0)
#ifdef LIBXML_READER_ENABLED
        && (lint->stream == 0)
#endif /* LIBXML_READER_ENABLED */
	) {
	xmlSchematronParserCtxtPtr ctxt;

        /* forces loading the DTDs */
	lint->options |= XML_PARSE_DTDLOAD;
	if (lint->timing) {
	    startTimer(lint);
	}
	ctxt = xmlSchematronNewParserCtxt(lint->schematron);
        if (ctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }
	lint->wxschematron = xmlSchematronParse(ctxt);
	if (lint->wxschematron == NULL) {
	    fprintf(errStream, "Schematron schema %s failed to compile\n",
                    lint->schematron);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            goto error;
	}
	xmlSchematronFreeParserCtxt(ctxt);
	if (lint->timing) {
	    endTimer(lint, "Compiling the schemas");
	}
    }
#endif

#ifdef LIBXML_SCHEMAS_ENABLED
    if ((lint->relaxng != NULL) && (lint->sax == 0)
#ifdef LIBXML_READER_ENABLED
        && (lint->stream == 0)
#endif /* LIBXML_READER_ENABLED */
	) {
	xmlRelaxNGParserCtxtPtr ctxt;

        /* forces loading the DTDs */
	lint->options |= XML_PARSE_DTDLOAD;
	if (lint->timing) {
	    startTimer(lint);
	}
	ctxt = xmlRelaxNGNewParserCtxt(lint->relaxng);
        if (ctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }
        xmlRelaxNGSetResourceLoader(ctxt, xmllintResourceLoader, lint);
	lint->relaxngschemas = xmlRelaxNGParse(ctxt);
	if (lint->relaxngschemas == NULL) {
	    fprintf(errStream, "Relax-NG schema %s failed to compile\n",
                    lint->relaxng);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            goto error;
	}
	xmlRelaxNGFreeParserCtxt(ctxt);
	if (lint->timing) {
	    endTimer(lint, "Compiling the schemas");
	}
    } else if ((lint->schema != NULL)
#ifdef LIBXML_READER_ENABLED
		&& (lint->stream == 0)
#endif
	) {
	xmlSchemaParserCtxtPtr ctxt;

	if (lint->timing) {
	    startTimer(lint);
	}
	ctxt = xmlSchemaNewParserCtxt(lint->schema);
        if (ctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }
        xmlSchemaSetResourceLoader(ctxt, xmllintResourceLoader, lint);
	lint->wxschemas = xmlSchemaParse(ctxt);
	if (lint->wxschemas == NULL) {
	    fprintf(errStream, "WXS schema %s failed to compile\n",
                    lint->schema);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            goto error;
	}
	xmlSchemaFreeParserCtxt(ctxt);
	if (lint->timing) {
	    endTimer(lint, "Compiling the schemas");
	}
    }
#endif /* LIBXML_SCHEMAS_ENABLED */

#if defined(LIBXML_READER_ENABLED) && defined(LIBXML_PATTERN_ENABLED)
    if ((lint->pattern != NULL) && (lint->walker == 0)) {
        res = xmlPatternCompileSafe(BAD_CAST lint->pattern, NULL, 0, NULL,
                                    &lint->patternc);
	if (lint->patternc == NULL) {
            if (res < 0) {
                lint->progresult = XMLLINT_ERR_MEM;
            } else {
                fprintf(errStream, "Pattern %s failed to compile\n",
                        lint->pattern);
                lint->progresult = XMLLINT_ERR_SCHEMAPAT;
            }
            goto error;
	}
    }
#endif /* LIBXML_READER_ENABLED && LIBXML_PATTERN_ENABLED */

    /*
     * The main loop over input documents
     */
    for (i = 1; i < argc ; i++) {
        const char *filename = argv[i];
#if HAVE_DECL_MMAP
        int memoryFd = -1;
#endif

	if ((filename[0] == '-') && (strcmp(filename, "-") != 0)) {
            i += skipArgs(filename);
            continue;
        }

#if HAVE_DECL_MMAP
        if (lint->memory) {
            struct stat info;
            if (stat(filename, &info) < 0) {
                lint->progresult = XMLLINT_ERR_RDFILE;
                break;
            }
            memoryFd = open(filename, O_RDONLY);
            if (memoryFd < 0) {
                lint->progresult = XMLLINT_ERR_RDFILE;
                break;
            }
            lint->memoryData = mmap(NULL, info.st_size + 1, PROT_READ,
                                    MAP_SHARED, memoryFd, 0);
            if (lint->memoryData == (void *) MAP_FAILED) {
                close(memoryFd);
                fprintf(errStream, "mmap failure for file %s\n", filename);
                lint->progresult = XMLLINT_ERR_RDFILE;
                break;
            }
            lint->memorySize = info.st_size;
        }
#endif /* HAVE_DECL_MMAP */

	if ((lint->timing) && (lint->repeat > 1))
	    startTimer(lint);

#ifdef LIBXML_READER_ENABLED
        if (lint->stream != 0) {
            for (j = 0; j < lint->repeat; j++)
                streamFile(lint, filename);
        } else
#endif /* LIBXML_READER_ENABLED */
        {
            xmlParserCtxtPtr ctxt;

#ifdef LIBXML_HTML_ENABLED
            if (lint->html) {
#ifdef LIBXML_PUSH_ENABLED
                if (lint->push) {
                    ctxt = htmlCreatePushParserCtxt(NULL, NULL, NULL, 0,
                                                    filename,
                                                    XML_CHAR_ENCODING_NONE);
                    htmlCtxtUseOptions(ctxt, lint->options);
                } else
#endif /* LIBXML_PUSH_ENABLED */
                {
                    ctxt = htmlNewParserCtxt();
                }
            } else
#endif /* LIBXML_HTML_ENABLED */
            {
#ifdef LIBXML_PUSH_ENABLED
                if (lint->push) {
                    ctxt = xmlCreatePushParserCtxt(NULL, NULL, NULL, 0,
                                                   filename);
                    xmlCtxtUseOptions(ctxt, lint->options);
                } else
#endif /* LIBXML_PUSH_ENABLED */
                {
                    ctxt = xmlNewParserCtxt();
                }
            }
            if (ctxt == NULL) {
                lint->progresult = XMLLINT_ERR_MEM;
                goto error;
            }

            if (lint->sax) {
                const xmlSAXHandler *handler;

                if (lint->noout) {
                    handler = &emptySAXHandler;
#ifdef LIBXML_SAX1_ENABLED
                } else if (lint->options & XML_PARSE_SAX1) {
                    handler = &debugSAXHandler;
#endif
                } else {
                    handler = &debugSAX2Handler;
                }

                *ctxt->sax = *handler;
                ctxt->userData = lint;
            }

            xmlCtxtSetResourceLoader(ctxt, xmllintResourceLoader, lint);
            if (lint->maxAmpl > 0)
                xmlCtxtSetMaxAmplification(ctxt, lint->maxAmpl);

            if (lint->htmlout) {
                ctxt->_private = lint;
                xmlCtxtSetErrorHandler(ctxt, xmlHTMLError, ctxt);
            }

            lint->ctxt = ctxt;

            for (j = 0; j < lint->repeat; j++) {
#ifdef LIBXML_PUSH_ENABLED
                if ((lint->push) && (j > 0))
                    xmlCtxtResetPush(ctxt, NULL, 0, NULL, NULL);
#endif
                if (lint->sax) {
                    testSAX(lint, filename);
                } else {
                    parseAndPrintFile(lint, filename);
                }
            }

            xmlFreeParserCtxt(ctxt);
        }

        if ((lint->timing) && (lint->repeat > 1)) {
            endTimer(lint, "%d iterations", lint->repeat);
        }

        files += 1;

#if HAVE_DECL_MMAP
        if (lint->memory) {
            munmap(lint->memoryData, lint->memorySize);
            close(memoryFd);
        }
#endif
    }

    if (lint->generate)
	parseAndPrintFile(lint, NULL);

    if ((lint->htmlout) && (!lint->nowrap)) {
	fprintf(errStream, "</body></html>\n");
    }

    if ((files == 0) && (!lint->generate) && (lint->version == 0)) {
	usage(errStream, argv[0]);
        lint->progresult = XMLLINT_ERR_UNCLASS;
    }

error:

    if (lint->htmlout)
        xmlFree(lint->htmlBuf);

#ifdef LIBXML_SCHEMATRON_ENABLED
    if (lint->wxschematron != NULL)
	xmlSchematronFree(lint->wxschematron);
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
    if (lint->relaxngschemas != NULL)
	xmlRelaxNGFree(lint->relaxngschemas);
    if (lint->wxschemas != NULL)
	xmlSchemaFree(lint->wxschemas);
#endif
#if defined(LIBXML_READER_ENABLED) && defined(LIBXML_PATTERN_ENABLED)
    if (lint->patternc != NULL)
        xmlFreePattern(lint->patternc);
#endif

    xmlCleanupParser();

    if ((lint->maxmem) && (xmllintMaxmemReached)) {
        fprintf(errStream, "Maximum memory exceeded (%d bytes)\n",
                xmllintMaxmem);
    } else if (lint->progresult == XMLLINT_ERR_MEM) {
        fprintf(errStream, "Out-of-memory error reported\n");
    }

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if ((lint->maxmem) &&
        (xmllintOom != (lint->progresult == XMLLINT_ERR_MEM))) {
        fprintf(stderr, "xmllint: malloc failure %s reported\n",
                xmllintOom ? "not" : "erroneously");
        abort();
    }
#endif

    return(lint->progresult);
}